

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O3

bool __thiscall mcsFile::toHex(mcsFile *this,char *p2,uchar *result)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  byte bVar6;
  
  *result = '\0';
  lVar5 = 0;
  bVar6 = 0;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    bVar2 = p2[lVar5] - 0x30;
    if (9 < bVar2) {
      iVar3 = toupper((int)p2[lVar5]);
      if ((byte)((char)iVar3 + 0xb9U) < 0xfa) {
        return false;
      }
      bVar2 = (char)iVar3 - 0x37;
    }
    bVar6 = bVar6 | bVar2 << ((char)lVar5 * -4 + 4U & 0x1f);
    *result = bVar6;
    lVar5 = 1;
    bVar1 = false;
  } while (bVar4);
  return true;
}

Assistant:

bool mcsFile::toHex(const char *p2, unsigned char &result) const
{
    const unsigned int NUM_DIGITS = 2;
    unsigned char digit[NUM_DIGITS];
    result = 0;
    for (unsigned int i = 0; i < NUM_DIGITS; i++) {
        digit[i] = p2[i]-'0';
        if (digit[i] > 9) {
            digit[i] = toupper(p2[i])-'A';
            if (digit[i] > 5) return false;
            digit[i] += 10;
        }
        result |= digit[i] << (4*(NUM_DIGITS-i-1));
    }
    return true;
}